

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O2

int pt_qry_fetch_event(pt_query_decoder *decoder)

{
  int iVar1;
  
  iVar1 = pt_evt_next(&decoder->evdec,&decoder->event,0x48);
  if (iVar1 < 0) {
    decoder->status = iVar1;
    (decoder->event).variant.mwait.hints = 0xffffffff;
    (decoder->event).variant.mwait.ext = 0xffffffff;
    *(undefined4 *)((long)&(decoder->event).variant + 0x10) = 0xffffffff;
    *(undefined4 *)((long)&(decoder->event).variant + 0x14) = 0xffffffff;
    *(undefined4 *)((decoder->event).reserved + 1) = 0xffffffff;
    *(undefined4 *)((long)(decoder->event).reserved + 0xc) = 0xffffffff;
    (decoder->event).variant.exec_mode.mode = ~ptem_unknown;
    *(undefined4 *)((long)&(decoder->event).variant + 4) = 0xffffffff;
    (decoder->event).lost_mtc = 0xffffffff;
    (decoder->event).lost_cyc = 0xffffffff;
    *(undefined4 *)(decoder->event).reserved = 0xffffffff;
    *(undefined4 *)((long)(decoder->event).reserved + 4) = 0xffffffff;
    (decoder->event).type = ~ptev_enabled;
    *(undefined4 *)&(decoder->event).field_0x4 = 0xffffffff;
    *(undefined4 *)&(decoder->event).tsc = 0xffffffff;
    *(undefined4 *)((long)&(decoder->event).tsc + 4) = 0xffffffff;
    (decoder->event).variant.vmexit.ip = 0xffffffffffffffff;
  }
  return iVar1;
}

Assistant:

static int pt_qry_fetch_event(struct pt_query_decoder *decoder)
{
	struct pt_event *ev;
	int errcode;

	if (!decoder)
		return -pte_internal;

	ev = &decoder->event;

	errcode = pt_evt_next(&decoder->evdec, ev, sizeof(*ev));
	if (errcode < 0) {
		decoder->status = errcode;
		memset(ev, 0xff, sizeof(*ev));
	}

	return 0;
}